

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O1

void RVO::linearProgram4(vector<RVO::Plane,_std::allocator<RVO::Plane>_> *planes,size_t numObstacles
                        ,size_t beginPlane,float radius,Vector3 *result)

{
  float fVar1;
  pointer pPVar2;
  pointer pPVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  __normal_iterator<const_RVO::Plane_*,_std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>_>
  __first;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  vector<RVO::Plane,_std::allocator<RVO::Plane>_> projPlanes;
  value_type local_88;
  float local_64;
  ulong local_60;
  vector<RVO::Plane,_std::allocator<RVO::Plane>_> local_58;
  long local_40;
  long local_38;
  
  __first._M_current =
       (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
       super__Vector_impl_data._M_start;
  uVar4 = ((long)(planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)__first._M_current >> 3) *
          -0x5555555555555555;
  if (beginPlane <= uVar4 && uVar4 - beginPlane != 0) {
    local_38 = numObstacles * 3;
    local_40 = numObstacles * 0x18 + 0x14;
    fVar8 = 0.0;
    local_64 = radius;
    local_60 = numObstacles;
    do {
      if (fVar8 < (__first._M_current[beginPlane].point.val_[2] - result->val_[2]) *
                  __first._M_current[beginPlane].normal.val_[2] +
                  (__first._M_current[beginPlane].point.val_[0] - result->val_[0]) *
                  __first._M_current[beginPlane].normal.val_[0] +
                  (__first._M_current[beginPlane].point.val_[1] - result->val_[1]) *
                  __first._M_current[beginPlane].normal.val_[1]) {
        std::vector<RVO::Plane,std::allocator<RVO::Plane>>::
        vector<__gnu_cxx::__normal_iterator<RVO::Plane_const*,std::vector<RVO::Plane,std::allocator<RVO::Plane>>>,void>
                  ((vector<RVO::Plane,std::allocator<RVO::Plane>> *)&local_58,__first,
                   (Plane *)(((__first._M_current)->point).val_ + local_38 * 2),
                   (allocator_type *)&local_88);
        lVar6 = local_40;
        for (uVar4 = local_60; uVar4 < beginPlane; uVar4 = uVar4 + 1) {
          local_88.point.val_[0] = 0.0;
          local_88.point.val_[1] = 0.0;
          local_88.point.val_[2] = 0.0;
          local_88.normal.val_[0] = 0.0;
          local_88.normal.val_[1] = 0.0;
          local_88.normal.val_[2] = 0.0;
          pPVar2 = (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pPVar3 = pPVar2 + beginPlane;
          fVar8 = *(float *)((long)(pPVar2->point).val_ + lVar6 + -8);
          fVar7 = *(float *)((long)(pPVar2->point).val_ + lVar6 + -4);
          fVar11 = (pPVar3->normal).val_[2];
          fVar13 = *(float *)((long)(pPVar2->point).val_ + lVar6);
          fVar1 = (pPVar3->normal).val_[0];
          fVar10 = (pPVar3->normal).val_[1];
          fVar9 = fVar7 * fVar11 - fVar10 * fVar13;
          fVar15 = fVar13 * fVar1 - fVar11 * fVar8;
          fVar12 = fVar8 * fVar10 - fVar1 * fVar7;
          if (fVar12 * fVar12 + fVar9 * fVar9 + fVar15 * fVar15 <= 1e-05) {
            if (fVar11 * fVar13 + fVar1 * fVar8 + fVar7 * fVar10 <= 0.0) {
              local_88.point.val_[2] =
                   ((pPVar3->point).val_[2] + *(float *)((long)(&pPVar2->point + -1) + lVar6)) * 0.5
              ;
              local_88.point.val_[1] =
                   ((pPVar3->point).val_[1] + *(float *)((long)(pPVar2->point).val_ + lVar6 + -0x10)
                   ) * 0.5;
              local_88.point.val_[0] =
                   ((pPVar3->point).val_[0] + *(float *)((long)(pPVar2->point).val_ + lVar6 + -0x14)
                   ) * 0.5;
              goto LAB_001064cf;
            }
          }
          else {
            fVar14 = fVar15 * fVar11 - fVar10 * fVar12;
            fVar12 = fVar12 * fVar1 - fVar11 * fVar9;
            fVar10 = fVar9 * fVar10 - fVar1 * fVar15;
            fVar11 = (pPVar3->point).val_[0];
            fVar1 = (pPVar3->point).val_[1];
            local_88.point.val_[2] = (pPVar3->point).val_[2];
            fVar8 = ((*(float *)((long)(&pPVar2->point + -1) + lVar6) - local_88.point.val_[2]) *
                     fVar13 + (*(float *)((long)(pPVar2->point).val_ + lVar6 + -0x14) - fVar11) *
                              fVar8 + (*(float *)((long)(pPVar2->point).val_ + lVar6 + -0x10) -
                                      fVar1) * fVar7) /
                    (fVar13 * fVar10 + fVar8 * fVar14 + fVar7 * fVar12);
            local_88.point.val_[2] = fVar8 * fVar10 + local_88.point.val_[2];
            local_88.point.val_[1] = fVar12 * fVar8 + fVar1;
            local_88.point.val_[0] = fVar14 * fVar8 + fVar11;
LAB_001064cf:
            local_88.normal.val_[0] = 0.0;
            fVar7 = *(float *)((long)(pPVar2->point).val_ + lVar6 + -8) - (pPVar3->normal).val_[0];
            fVar11 = *(float *)((long)(pPVar2->point).val_ + lVar6 + -4) - (pPVar3->normal).val_[1];
            fVar13 = *(float *)((long)(pPVar2->point).val_ + lVar6) - (pPVar3->normal).val_[2];
            fVar8 = fVar13 * fVar13 + fVar7 * fVar7 + fVar11 * fVar11;
            if (fVar8 < 0.0) {
              fVar8 = sqrtf(fVar8);
            }
            else {
              fVar8 = SQRT(fVar8);
            }
            fVar8 = 1.0 / fVar8;
            local_88.normal.val_[0] = fVar7 * fVar8;
            local_88.normal.val_[2] = fVar13 * fVar8;
            local_88.normal.val_[1] = fVar11 * fVar8;
            std::vector<RVO::Plane,_std::allocator<RVO::Plane>_>::push_back(&local_58,&local_88);
          }
          lVar6 = lVar6 + 0x18;
        }
        fVar8 = result->val_[0];
        fVar7 = result->val_[1];
        fVar11 = result->val_[2];
        sVar5 = linearProgram3(&local_58,local_64,
                               &(planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>
                                )._M_impl.super__Vector_impl_data._M_start[beginPlane].normal,true,
                               result);
        if (sVar5 < (ulong)(((long)local_58.
                                   super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_58.
                                   super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555)) {
          result->val_[0] = fVar8;
          result->val_[1] = fVar7;
          result->val_[2] = fVar11;
        }
        pPVar3 = (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        fVar8 = pPVar3[beginPlane].point.val_[0];
        fVar7 = pPVar3[beginPlane].point.val_[1];
        fVar11 = result->val_[0];
        fVar13 = result->val_[1];
        fVar1 = pPVar3[beginPlane].point.val_[2];
        fVar10 = result->val_[2];
        fVar9 = pPVar3[beginPlane].normal.val_[1];
        fVar12 = pPVar3[beginPlane].normal.val_[0];
        fVar15 = pPVar3[beginPlane].normal.val_[2];
        if (local_58.super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        fVar8 = (fVar1 - fVar10) * fVar15 + (fVar8 - fVar11) * fVar12 + (fVar7 - fVar13) * fVar9;
      }
      beginPlane = beginPlane + 1;
      __first._M_current =
           (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
           super__Vector_impl_data._M_start;
    } while (beginPlane <
             (ulong)(((long)(planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)__first._M_current >>
                     3) * -0x5555555555555555));
  }
  return;
}

Assistant:

void linearProgram4(const std::vector<Plane> &planes, size_t numObstacles, size_t beginPlane, float radius, Vector3 &result)
	{
		float distance = 0.0f;

		for (size_t i = beginPlane; i < planes.size(); ++i) {
			if (planes[i].normal * (planes[i].point - result) > distance) {
				/* Result does not satisfy constraint of plane i. */
				std::vector<Plane> projPlanes(planes.begin(), planes.begin() + static_cast<ptrdiff_t>(numObstacles));

				for (size_t j = numObstacles; j < i; ++j) {
					Plane plane;

					const Vector3 crossProduct = cross(planes[j].normal, planes[i].normal);

					if (absSq(crossProduct) <= RVO_EPSILON) {
						/* Plane i and plane j are (almost) parallel. */
						if (planes[i].normal * planes[j].normal > 0.0f) {
							/* Plane i and plane j point in the same direction. */
							continue;
						}
						else {
							/* Plane i and plane j point in opposite direction. */
							plane.point = 0.5f * (planes[i].point + planes[j].point);
						}
					}
					else {
						/* Plane.point is point on line of intersection between plane i and plane j. */
						const Vector3 lineNormal = cross(crossProduct, planes[i].normal);
						plane.point = planes[i].point + (((planes[j].point - planes[i].point) * planes[j].normal) / (lineNormal * planes[j].normal)) * lineNormal;
					}

					plane.normal = normalize(planes[j].normal - planes[i].normal);
					projPlanes.push_back(plane);
				}

				const Vector3 tempResult = result;

				if (linearProgram3(projPlanes, radius, planes[i].normal, true, result) < projPlanes.size()) {
					/* This should in principle not happen.  The result is by definition already in the feasible region of this linear program. If it fails, it is due to small floating point error, and the current result is kept. */
					result = tempResult;
				}

				distance = planes[i].normal * (planes[i].point - result);
			}
		}
	}